

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_lines_down(Fl_Input *this,int repeat_num)

{
  int iVar1;
  int i;
  uint uVar2;
  bool bVar3;
  
  i = (this->super_Fl_Input_).position_;
  iVar1 = Fl_Input_::line_end(&this->super_Fl_Input_,i);
  if (iVar1 < (this->super_Fl_Input_).size_) {
    while (bVar3 = repeat_num != 0, repeat_num = repeat_num + -1, bVar3) {
      i = Fl_Input_::line_end(&this->super_Fl_Input_,i);
      if ((this->super_Fl_Input_).size_ <= i) break;
      i = i + 1;
    }
    shift_up_down_position(this,i);
    uVar2 = 1;
  }
  else {
    bVar3 = Fl::option(OPTION_ARROW_FOCUS);
    uVar2 = (uint)!bVar3;
  }
  return uVar2;
}

Assistant:

int Fl_Input::kf_lines_down(int repeat_num) {
  int i = position();
  if (line_end(i) >= size()) {
    //UNNEEDED if (input_type()==FL_MULTILINE_INPUT && !Fl::option(Fl::OPTION_ARROW_FOCUS)) return 1;
    return NORMAL_INPUT_MOVE;
  }
  while (repeat_num--) {  
    i = line_end(i);
    if (i >= size()) break;
    i++;
  }
  shift_up_down_position(i);
  return 1;
}